

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O3

bool __thiscall FIX::Initiator::isConnected(Initiator *this,SessionID *sessionID)

{
  int iVar1;
  iterator iVar2;
  
  Mutex::lock(&this->m_mutex);
  iVar2 = std::
          _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
          ::find(&(this->m_connected)._M_t,sessionID);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return (_Rb_tree_header *)iVar2._M_node != &(this->m_connected)._M_t._M_impl.super__Rb_tree_header
  ;
}

Assistant:

bool Initiator::isConnected( const SessionID& sessionID )
{
  Locker l(m_mutex);
  return m_connected.find( sessionID ) != m_connected.end();
}